

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseNextOperator(Parser *this,Value *value)

{
  bool bVar1;
  TokenType TVar2;
  undefined4 *in_RSI;
  Parser *in_RDI;
  
  bVar1 = hasNext(in_RDI);
  if (bVar1) {
    TVar2 = next((Parser *)0xa3be66);
    if (TVar2 == COMMA) {
      *in_RSI = 0xb;
      skipSpace(in_RDI);
    }
    else if (TVar2 == SLASH) {
      *in_RSI = 10;
      skipSpace(in_RDI);
    }
    else {
      prev(in_RDI);
    }
  }
  return true;
}

Assistant:

bool Parser::parseNextOperator(Value *value)
{
    if (!hasNext()) return true;
    switch (next()) {
        case SLASH: value->type = Value::TermOperatorSlash; skipSpace(); break;
        case COMMA: value->type = Value::TermOperatorComma; skipSpace(); break;
        default: prev(); break;
    }
    return true;
}